

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O0

int __thiscall menuwindow::find_selected(menuwindow *this,int mx,int my)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Fl_Boxtype FVar4;
  Fl_Menu_Item *local_50;
  Fl_Menu_Item *pFStack_30;
  int n;
  Fl_Menu_Item *m;
  int n_1;
  int xx;
  int my_local;
  int mx_local;
  menuwindow *this_local;
  
  if ((this->menu == (Fl_Menu_Item *)0x0) || (this->menu->text == (char *)0x0)) {
    this_local._4_4_ = -1;
  }
  else {
    iVar1 = Fl_Widget::x((Fl_Widget *)this);
    iVar1 = mx - iVar1;
    iVar2 = Fl_Widget::y((Fl_Widget *)this);
    iVar2 = my - iVar2;
    if ((iVar2 < 0) || (iVar3 = Fl_Widget::h((Fl_Widget *)this), iVar3 <= iVar2)) {
      this_local._4_4_ = -1;
    }
    else if (this->itemheight == 0) {
      m._4_4_ = 3;
      m._0_4_ = 0;
      if (this->menu == (Fl_Menu_Item *)0x0) {
        local_50 = (Fl_Menu_Item *)0x0;
      }
      else {
        local_50 = Fl_Menu_Item::first(this->menu);
      }
      pFStack_30 = local_50;
      while (pFStack_30->text != (char *)0x0) {
        iVar2 = Fl_Menu_Item::measure(pFStack_30,(int *)0x0,button);
        m._4_4_ = iVar2 + 0x10 + m._4_4_;
        if (iVar1 < m._4_4_) {
          return (int)m;
        }
        pFStack_30 = Fl_Menu_Item::next(pFStack_30,1);
        m._0_4_ = (int)m + 1;
      }
      this_local._4_4_ = -1;
    }
    else {
      FVar4 = Fl_Widget::box((Fl_Widget *)this);
      iVar3 = Fl::box_dx(FVar4);
      if ((iVar1 < iVar3) || (iVar3 = Fl_Widget::w((Fl_Widget *)this), iVar3 <= iVar1)) {
        this_local._4_4_ = -1;
      }
      else {
        FVar4 = Fl_Widget::box((Fl_Widget *)this);
        iVar1 = Fl::box_dx(FVar4);
        this_local._4_4_ = ((iVar2 - iVar1) + -1) / this->itemheight;
        if ((this_local._4_4_ < 0) || (this->numitems <= this_local._4_4_)) {
          this_local._4_4_ = -1;
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int menuwindow::find_selected(int mx, int my) {
  if (!menu || !menu->text) return -1;
  mx -= x();
  my -= y();
  if (my < 0 || my >= h()) return -1;
  if (!itemheight) { // menubar
    int xx = 3; int n = 0;
    const Fl_Menu_Item* m = menu ? menu->first() : 0;
    for (; ; m = m->next(), n++) {
      if (!m->text) return -1;
      xx += m->measure(0, button) + 16;
      if (xx > mx) break;
    }
    return n;
  }
  if (mx < Fl::box_dx(box()) || mx >= w()) return -1;
  int n = (my-Fl::box_dx(box())-1)/itemheight;
  if (n < 0 || n>=numitems) return -1;
  return n;
}